

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     Finalize<duckdb::FirstState<float>,float,duckdb::FirstFunction<false,true>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  undefined4 *puVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  idx_t iVar4;
  AggregateFinalizeData finalize_data;
  AggregateFinalizeData local_48;
  
  local_48.result = result;
  local_48.input = aggr_input_data;
  if (states->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    local_48.result_idx = 0;
    puVar1 = *(undefined4 **)states->data;
    if ((*(char *)(puVar1 + 1) == '\x01') && (*(char *)((long)puVar1 + 5) != '\x01')) {
      *(undefined4 *)result->data = *puVar1;
    }
    else {
      AggregateFinalizeData::ReturnNull(&local_48);
    }
  }
  else {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar2 = states->data;
    pdVar3 = result->data;
    if (count != 0) {
      iVar4 = 0;
      do {
        local_48.result_idx = offset + iVar4;
        puVar1 = *(undefined4 **)(pdVar2 + iVar4 * 8);
        if ((*(char *)(puVar1 + 1) == '\x01') && (*(char *)((long)puVar1 + 5) != '\x01')) {
          *(undefined4 *)(pdVar3 + iVar4 * 4 + offset * 4) = *puVar1;
        }
        else {
          AggregateFinalizeData::ReturnNull(&local_48);
        }
        iVar4 = iVar4 + 1;
      } while (count != iVar4);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}